

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

ostream_t * el::base::utils::operator<<(ostream_t *os,CommandLineArgs *c)

{
  ostream *poVar1;
  int local_1c;
  int i;
  CommandLineArgs *c_local;
  ostream_t *os_local;
  
  for (local_1c = 1; local_1c < c->m_argc; local_1c = local_1c + 1) {
    poVar1 = ::std::operator<<(os,"[");
    poVar1 = ::std::operator<<(poVar1,c->m_argv[local_1c]);
    ::std::operator<<(poVar1,"]");
    if (local_1c < c->m_argc + -1) {
      ::std::operator<<(os," ");
    }
  }
  return os;
}

Assistant:

base::type::ostream_t& operator<<(base::type::ostream_t& os, const CommandLineArgs& c) {
  for (int i = 1; i < c.m_argc; ++i) {
    os << ELPP_LITERAL("[") << c.m_argv[i] << ELPP_LITERAL("]");
    if (i < c.m_argc - 1) {
      os << ELPP_LITERAL(" ");
    }
  }
  return os;
}